

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::full_time(spec *s)

{
  sequence *in_RDI;
  spec *in_stack_000000b8;
  spec *in_stack_000001e8;
  sequence *this;
  either *in_stack_ffffffffffffffa0;
  sequence *in_stack_ffffffffffffffa8;
  sequence *in_stack_ffffffffffffffb0;
  
  this = in_RDI;
  local_time(in_stack_000001e8);
  time_offset(in_stack_000000b8);
  sequence::sequence<toml::detail::sequence,toml::detail::either>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  either::~either((either *)this);
  sequence::~sequence(this);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence full_time(const spec& s)
{
    return sequence(local_time(s), time_offset(s));
}